

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O1

void llvm::report_fatal_error(Error *Err,bool GenCrashDiag)

{
  ErrorInfoBase *pEVar1;
  Twine ErrorBanner;
  ulong uVar2;
  Child local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined1 local_70 [8];
  string ErrMsg;
  raw_string_ostream ErrStream;
  
  pEVar1 = Err->Payload;
  uVar2 = (ulong)pEVar1 & 0xfffffffffffffffe;
  Err->Payload = (ErrorInfoBase *)(uVar2 != 0 | uVar2);
  if (uVar2 != 0) {
    local_70 = (undefined1  [8])&ErrMsg._M_string_length;
    ErrMsg._M_dataplus._M_p = (pointer)0x0;
    ErrMsg._M_string_length._0_1_ = 0;
    ErrStream.super_raw_ostream.OutBufCur._0_4_ = 1;
    ErrStream.super_raw_ostream._vptr_raw_ostream = (_func_int **)0x0;
    ErrStream.super_raw_ostream.OutBufStart = (char *)0x0;
    ErrStream.super_raw_ostream.OutBufEnd = (char *)0x0;
    ErrMsg.field_2._8_8_ = &PTR__raw_string_ostream_010994b8;
    ErrStream.super_raw_ostream._32_8_ = local_70;
    ErrStream.OS = (string *)((ulong)pEVar1 | 1);
    Err->Payload = (ErrorInfoBase *)0x0;
    Twine::Twine((Twine *)&local_88);
    ErrorBanner.RHS = (Child)uStack_80;
    ErrorBanner.LHS.twine = local_88.twine;
    ErrorBanner.LHSKind = (undefined1)local_78;
    ErrorBanner.RHSKind = local_78._1_1_;
    ErrorBanner._18_6_ = local_78._2_6_;
    logAllUnhandledErrors
              ((Error *)&ErrStream.OS,(raw_ostream *)((long)&ErrMsg.field_2 + 8),ErrorBanner);
    if ((long *)((ulong)ErrStream.OS & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)((ulong)ErrStream.OS & 0xfffffffffffffffe) + 8))();
    }
    raw_string_ostream::~raw_string_ostream((raw_string_ostream *)((long)&ErrMsg.field_2 + 8));
    report_fatal_error((string *)local_70,true);
  }
  __assert_fail("Err && \"report_fatal_error called with success value\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/Error.cpp"
                ,0x8b,"void llvm::report_fatal_error(Error, bool)");
}

Assistant:

void report_fatal_error(Error Err, bool GenCrashDiag) {
  assert(Err && "report_fatal_error called with success value");
  std::string ErrMsg;
  {
    raw_string_ostream ErrStream(ErrMsg);
    logAllUnhandledErrors(std::move(Err), ErrStream);
  }
  report_fatal_error(ErrMsg);
}